

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

void __thiscall
andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
          (Iterator<int,_true,_std::allocator<unsigned_long>_> *this,
          View<int,_true,_std::allocator<unsigned_long>_> *view,size_t index)

{
  size_t this_00;
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  CoordinateOrder *pCVar4;
  reference pvVar5;
  size_type dimension;
  size_t sVar6;
  reference piVar7;
  iterator outit;
  size_type local_50;
  size_t j_1;
  size_t d;
  size_t j;
  allocator<unsigned_long> local_21;
  size_t local_20;
  size_t index_local;
  View<int,_true,_std::allocator<unsigned_long>_> *view_local;
  Iterator<int,_true,_std::allocator<unsigned_long>_> *this_local;
  
  this->view_ = view;
  this->pointer_ = (pointer)0x0;
  this->index_ = index;
  local_20 = index;
  index_local = (size_t)view;
  view_local = (View<int,_true,_std::allocator<unsigned_long>_> *)this;
  sVar2 = View<int,_true,_std::allocator<unsigned_long>_>::dimension(view);
  std::allocator<unsigned_long>::allocator(&local_21);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&this->coordinates_,sVar2,&local_21);
  std::allocator<unsigned_long>::~allocator(&local_21);
  sVar2 = View<int,_true,_std::allocator<unsigned_long>_>::size
                    ((View<int,_true,_std::allocator<unsigned_long>_> *)index_local);
  if (sVar2 == 0) {
    marray_detail::Assert<bool>(local_20 == 0);
  }
  else {
    bVar1 = View<int,_true,_std::allocator<unsigned_long>_>::isSimple
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)index_local);
    sVar2 = local_20;
    if (bVar1) {
      sVar6 = View<int,_true,_std::allocator<unsigned_long>_>::size
                        ((View<int,_true,_std::allocator<unsigned_long>_> *)index_local);
      marray_detail::Assert<bool>(sVar2 <= sVar6);
      piVar7 = View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)index_local,0);
      this->pointer_ = piVar7 + local_20;
    }
    else {
      sVar3 = View<int,_true,_std::allocator<unsigned_long>_>::size
                        ((View<int,_true,_std::allocator<unsigned_long>_> *)index_local);
      this_00 = index_local;
      sVar6 = local_20;
      if (sVar2 < sVar3) {
        outit = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                          (&this->coordinates_);
        View<int,true,std::allocator<unsigned_long>>::
        indexToCoordinates<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                  ((View<int,true,std::allocator<unsigned_long>> *)this_00,sVar6,
                   (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    )outit._M_current);
        piVar7 = View<int,_true,_std::allocator<unsigned_long>_>::operator()
                           ((View<int,_true,_std::allocator<unsigned_long>_> *)index_local,local_20)
        ;
        this->pointer_ = piVar7;
      }
      else {
        pCVar4 = View<int,_true,_std::allocator<unsigned_long>_>::coordinateOrder(this->view_);
        if (*pCVar4 == LastMajorOrder) {
          sVar2 = View<int,_true,_std::allocator<unsigned_long>_>::shape
                            ((View<int,_true,_std::allocator<unsigned_long>_> *)index_local,0);
          pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (&this->coordinates_,0);
          *pvVar5 = sVar2;
          for (d = 1; sVar2 = View<int,_true,_std::allocator<unsigned_long>_>::dimension
                                        ((View<int,_true,_std::allocator<unsigned_long>_> *)
                                         index_local), d < sVar2; d = d + 1) {
            sVar2 = View<int,_true,_std::allocator<unsigned_long>_>::shape
                              ((View<int,_true,_std::allocator<unsigned_long>_> *)index_local,d);
            pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (&this->coordinates_,d);
            *pvVar5 = sVar2 - 1;
          }
        }
        else {
          sVar2 = View<int,_true,_std::allocator<unsigned_long>_>::dimension(this->view_);
          dimension = sVar2 - 1;
          sVar2 = View<int,_true,_std::allocator<unsigned_long>_>::shape
                            ((View<int,_true,_std::allocator<unsigned_long>_> *)index_local,
                             dimension);
          pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (&this->coordinates_,dimension);
          *pvVar5 = sVar2;
          for (local_50 = 0; local_50 < dimension; local_50 = local_50 + 1) {
            sVar2 = View<int,_true,_std::allocator<unsigned_long>_>::shape
                              ((View<int,_true,_std::allocator<unsigned_long>_> *)index_local,
                               local_50);
            pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (&this->coordinates_,local_50);
            *pvVar5 = sVar2 - 1;
          }
        }
        sVar2 = index_local;
        sVar6 = View<int,_true,_std::allocator<unsigned_long>_>::size
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)index_local);
        piVar7 = View<int,_true,_std::allocator<unsigned_long>_>::operator()
                           ((View<int,_true,_std::allocator<unsigned_long>_> *)sVar2,sVar6 - 1);
        this->pointer_ = piVar7 + 1;
      }
    }
  }
  testInvariant(this);
  return;
}

Assistant:

inline Iterator<T, isConst, A>::Iterator
(
    const View<T, true, A>& view,
    const std::size_t index
)
:   view_(&view),
    pointer_(0),
    index_(index),
    coordinates_(std::vector<std::size_t>(view.dimension()))
    // Note for developers: If isConst==false, the construction view_(&view)
    // fails due to incompatible types. This is intended because it should 
    // not be possible to construct a mutable iterator on constant data.
{
    if(view.size() == 0) { // un-initialized view
        marray_detail::Assert(MARRAY_NO_ARG_TEST || index == 0);
    }
    else {
        if(view.isSimple()) {
            marray_detail::Assert(MARRAY_NO_ARG_TEST || index <= view.size());
            pointer_ = &view(0) + index;
        }
        else {
            if(index >= view.size()) { // end iterator
                if(view_->coordinateOrder() == LastMajorOrder) {
                    coordinates_[0] = view.shape(0);
                    for(std::size_t j=1; j<view.dimension(); ++j) {
                        coordinates_[j] = view.shape(j)-1;
                    }
                }
                else { // FirstMajorOrder
                    std::size_t d = view_->dimension() - 1;
                    coordinates_[d] = view.shape(d);
                    for(std::size_t j=0; j<d; ++j) {
                        coordinates_[j] = view.shape(j)-1;
                    }
                }
                pointer_ = &view(view.size()-1) + 1;
            }
            else {
                view.indexToCoordinates(index, coordinates_.begin());
                pointer_ = &view(index);
            }
        }
    }
    testInvariant();
}